

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configset.hh
# Opt level: O3

bool __thiscall
utilmm::config_set::get<bool>(config_set *this,string *name,bool *defval,type *enabler)

{
  undefined1 uVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  list<bool,_std::allocator<bool>_> deflist;
  _List_node_base local_60;
  long local_50;
  _List_node_base local_48;
  
  local_60._M_next = &local_60;
  local_50 = 0;
  local_60._M_prev = local_60._M_next;
  p_Var3 = (_List_node_base *)operator_new(0x18);
  *(bool *)&p_Var3[1]._M_next = *defval;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  local_50 = local_50 + 1;
  get<std::__cxx11::list<bool,std::allocator<bool>>>
            ((list<bool,_std::allocator<bool>_> *)&local_48,this,name,
             (list<bool,_std::allocator<bool>_> *)&local_60,(type *)0x0);
  uVar1 = *(undefined1 *)&local_48._M_next[1]._M_next;
  while (p_Var3 = local_60._M_next, local_48._M_next != &local_48) {
    p_Var3 = (((_List_base<bool,_std::allocator<bool>_> *)&(local_48._M_next)->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(local_48._M_next);
    local_48._M_next = p_Var3;
  }
  while (p_Var3 != &local_60) {
    p_Var2 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var2;
  }
  return (bool)uVar1;
}

Assistant:

T config_set::get(std::string const& name, T const& defval,
            typename boost::disable_if< details::is_list<T> >::type *enabler) const
    {
        std::list<T> deflist;
        deflist.push_back(defval);
        return get< std::list<T> >(name, deflist).front();
    }